

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O2

RuleInfo * __thiscall
anon_unknown.dwarf_14a672::BuildEngineImpl::getRuleInfoForKey(BuildEngineImpl *this,KeyID keyID)

{
  BuildEngineDelegate *pBVar1;
  iterator iVar2;
  pointer *__ptr;
  RuleInfo *pRVar3;
  __uniq_ptr_impl<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_> local_58;
  key_type local_50;
  undefined1 local_48 [32];
  
  local_50._value = keyID._value;
  iVar2 = std::
          unordered_map<llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo,_std::hash<llbuild::core::KeyID>,_std::equal_to<llbuild::core::KeyID>,_std::allocator<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>_>_>
          ::find(&this->ruleInfos,&local_50);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
      ._M_cur == (__node_type *)0x0) {
    pBVar1 = this->delegate;
    (*(this->super_BuildDBDelegate)._vptr_BuildDBDelegate[3])(local_48,this,keyID._value);
    (*pBVar1->_vptr_BuildEngineDelegate[3])(&local_58,pBVar1,local_48);
    pRVar3 = addRule(this,keyID,
                     (unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_> *)
                     &local_58);
    if ((_Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>)
        local_58._M_t.
        super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>.
        super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl != (Rule *)0x0) {
      (**(code **)(*(long *)local_58._M_t.
                            super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>
                            .super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl + 8))
                ();
    }
    local_58._M_t.
    super__Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>.
    super__Head_base<0UL,_llbuild::core::Rule_*,_false>._M_head_impl =
         (tuple<llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>)
         (_Tuple_impl<0UL,_llbuild::core::Rule_*,_std::default_delete<llbuild::core::Rule>_>)0x0;
    std::__cxx11::string::_M_dispose();
  }
  else {
    pRVar3 = (RuleInfo *)
             ((long)iVar2.
                    super__Node_iterator_base<std::pair<const_llbuild::core::KeyID,_(anonymous_namespace)::BuildEngineImpl::RuleInfo>,_true>
                    ._M_cur + 0x10);
  }
  return pRVar3;
}

Assistant:

RuleInfo& getRuleInfoForKey(KeyID keyID) {
    // Check if we have already found the rule.
    auto it = ruleInfos.find(keyID);
    if (it != ruleInfos.end())
      return it->second;

    // Otherwise, we need to resolve the full key so we can request it from the
    // delegate.
    return addRule(keyID, delegate.lookupRule(getKeyForID(keyID)));
  }